

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void ParseSmpl(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  DWORD DVar1;
  undefined8 uVar2;
  DWORD chunklen_local;
  DWORD chunkid_local;
  FileReader *f_local;
  SFFile *sf2_local;
  
  if (sf2->SampleDataOffset == 0) {
    if ((chunklen & 1) != 0) {
      uVar2 = __cxa_allocate_exception(1);
      __cxa_throw(uVar2,&CBadForm::typeinfo,0);
    }
    DVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[3])();
    sf2->SampleDataOffset = DVar1;
    sf2->SizeSampleData = chunklen >> 1;
  }
  skip_chunk(f,chunklen);
  return;
}

Assistant:

static void ParseSmpl(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	// Only use the first smpl chunk. (Or should we reject files with more than one?)
	if (sf2->SampleDataOffset == 0)
	{
		if (chunklen & 1)
		{ // Chunk must be an even number of bytes.
			throw CBadForm();
		}
		sf2->SampleDataOffset = f->Tell();
		sf2->SizeSampleData = chunklen >> 1;
	}
	skip_chunk(f, chunklen);
}